

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O3

void g_tree_insert_internal(GTree *tree,gpointer key,gpointer value,gboolean replace)

{
  GDestroyNotify UNRECOVERED_JUMPTABLE;
  char cVar1;
  int iVar2;
  long lVar3;
  GTreeNode *pGVar4;
  GTreeNode *pGVar5;
  long *plVar6;
  bool bVar7;
  GTreeNode *path [40];
  long local_178;
  long local_170 [40];
  
  plVar6 = &local_178;
  pGVar5 = tree->root;
  if (pGVar5 == (GTreeNode *)0x0) {
    pGVar5 = (GTreeNode *)g_slice_alloc(0x28);
    pGVar5->left = (GTreeNode *)0x0;
    pGVar5->right = (GTreeNode *)0x0;
    *(undefined4 *)((long)&pGVar5->right + 7) = 0;
    pGVar5->key = key;
    pGVar5->value = value;
    tree->root = pGVar5;
    tree->nnodes = tree->nnodes + 1;
  }
  else {
    local_178 = 0;
    iVar2 = (*tree->key_compare)(key,pGVar5->key,tree->key_compare_data);
    while (iVar2 != 0) {
      if (iVar2 < 0) {
        lVar3 = 0x10;
        if (pGVar5->left_child == '\0') {
          pGVar4 = (GTreeNode *)g_slice_alloc(0x28);
          pGVar4->left = (GTreeNode *)0x0;
          pGVar4->right = (GTreeNode *)0x0;
          *(undefined4 *)((long)&pGVar4->right + 7) = 0;
          pGVar4->key = key;
          pGVar4->value = value;
          pGVar4->left = pGVar5->left;
          pGVar4->right = pGVar5;
          pGVar5->left = pGVar4;
          pGVar5->left_child = '\x01';
          cVar1 = -1;
          goto LAB_004d05f1;
        }
      }
      else {
        lVar3 = 0x18;
        if (pGVar5->right_child == '\0') {
          pGVar4 = (GTreeNode *)g_slice_alloc(0x28);
          pGVar4->left = (GTreeNode *)0x0;
          pGVar4->right = (GTreeNode *)0x0;
          *(undefined4 *)((long)&pGVar4->right + 7) = 0;
          pGVar4->key = key;
          pGVar4->value = value;
          pGVar4->right = pGVar5->right;
          pGVar4->left = pGVar5;
          pGVar5->right = pGVar4;
          pGVar5->right_child = '\x01';
          cVar1 = '\x01';
LAB_004d05f1:
          pGVar5->balance = pGVar5->balance + cVar1;
          tree->nnodes = tree->nnodes + 1;
          goto LAB_004d05f8;
        }
      }
      plVar6[1] = (long)pGVar5;
      plVar6 = plVar6 + 1;
      pGVar5 = *(GTreeNode **)((long)&pGVar5->key + lVar3);
      iVar2 = (*tree->key_compare)(key,pGVar5->key,tree->key_compare_data);
    }
    if (tree->value_destroy_func != (GDestroyNotify)0x0) {
      (*tree->value_destroy_func)(pGVar5->value);
    }
    pGVar5->value = value;
    UNRECOVERED_JUMPTABLE = tree->key_destroy_func;
    if (replace == 0) {
      if (UNRECOVERED_JUMPTABLE != (GDestroyNotify)0x0) {
        (*UNRECOVERED_JUMPTABLE)(key);
        return;
      }
    }
    else {
      if (UNRECOVERED_JUMPTABLE != (GDestroyNotify)0x0) {
        (*UNRECOVERED_JUMPTABLE)(pGVar5->key);
      }
      pGVar5->key = key;
    }
  }
  return;
LAB_004d05f8:
  pGVar4 = (GTreeNode *)*plVar6;
  if (pGVar4 == (GTreeNode *)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = pGVar5 == pGVar4->left;
  }
  if ((byte)(pGVar5->balance - 2U) < 0xfd) {
    pGVar5 = g_tree_node_balance(pGVar5);
    if (pGVar4 == (GTreeNode *)0x0) {
      tree->root = pGVar5;
      return;
    }
    if (bVar7) {
      pGVar4->left = pGVar5;
      cVar1 = -1;
      if (pGVar5->balance == '\0') {
        return;
      }
    }
    else {
      pGVar4->right = pGVar5;
      if (pGVar5->balance == '\0') {
        return;
      }
LAB_004d0664:
      cVar1 = '\x01';
    }
  }
  else {
    if (pGVar4 == (GTreeNode *)0x0) {
      return;
    }
    if (pGVar5->balance == '\0') {
      return;
    }
    cVar1 = -1;
    if (!bVar7) goto LAB_004d0664;
  }
  pGVar4->balance = pGVar4->balance + cVar1;
  plVar6 = plVar6 + -1;
  pGVar5 = pGVar4;
  goto LAB_004d05f8;
}

Assistant:

static void g_tree_insert_internal (GTree *tree, gpointer key, gpointer value, gboolean replace)
{
    GTreeNode *node;
    GTreeNode *path[MAX_GTREE_HEIGHT];
    int idx;

    g_return_if_fail (tree != NULL);

    if (!tree->root)
    {
        tree->root = g_tree_node_new (key, value);
        tree->nnodes++;
        return;
    }

    idx = 0;
    path[idx++] = NULL;
    node = tree->root;

    while (1)
    {
        int cmp = tree->key_compare (key, node->key, tree->key_compare_data);

        if (cmp == 0)
        {
            if (tree->value_destroy_func)
                tree->value_destroy_func (node->value);

            node->value = value;

            if (replace)
            {
                if (tree->key_destroy_func)
                    tree->key_destroy_func (node->key);

                node->key = key;
            }
            else
            {
                /* free the passed key */
                if (tree->key_destroy_func)
                    tree->key_destroy_func (key);
            }

            return;
        }
        else if (cmp < 0)
        {
            if (node->left_child)
            {
                path[idx++] = node;
                node = node->left;
            }
            else
            {
                GTreeNode *child = g_tree_node_new (key, value);

                child->left = node->left;
                child->right = node;
                node->left = child;
                node->left_child = TRUE;
                node->balance -= 1;

                tree->nnodes++;

                break;
            }
        }
        else
        {
            if (node->right_child)
            {
                path[idx++] = node;
                node = node->right;
            }
            else
            {
                GTreeNode *child = g_tree_node_new (key, value);

                child->right = node->right;
                child->left = node;
                node->right = child;
                node->right_child = TRUE;
                node->balance += 1;

                tree->nnodes++;

                break;
            }
        }
    }

    /* Restore balance. This is the goodness of a non-recursive
     * implementation, when we are done with balancing we 'break'
     * the loop and we are done.
     */
    while (1)
    {
        GTreeNode *bparent = path[--idx];
        gboolean left_node = (bparent && node == bparent->left);
        //g_assert (!bparent || bparent->left == node || bparent->right == node);

        if (node->balance < -1 || node->balance > 1)
        {
            node = g_tree_node_balance (node);
            if (bparent == NULL)
                tree->root = node;
            else if (left_node)
                bparent->left = node;
            else
                bparent->right = node;
        }

        if (node->balance == 0 || bparent == NULL)
            break;

        if (left_node)
            bparent->balance -= 1;
        else
            bparent->balance += 1;

        node = bparent;
    }
}